

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort_test.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  REF_INT position;
  REF_INT m;
  REF_INT sorted_index [7];
  REF_INT sorted [4];
  REF_INT original [4];
  int in_stack_ffffffffff85ed84;
  int in_stack_ffffffffff85ed88;
  int in_stack_ffffffffff85eda8;
  int iVar7;
  REF_GLOB in_stack_ffffffffff85edc8;
  int iVar8;
  int iVar9;
  undefined8 in_stack_ffffffffff85edd0;
  int iVar10;
  
  uVar1 = ref_sort_insertion_int
                    (4,(REF_INT *)&stack0xffffffffffc2f6c8,(REF_INT *)&stack0xffffffffff85edc8);
  iVar7 = (int)in_stack_ffffffffff85edc8;
  iVar8 = (int)((ulong)in_stack_ffffffffff85edc8 >> 0x20);
  iVar9 = (int)in_stack_ffffffffff85edd0;
  iVar10 = (int)((ulong)in_stack_ffffffffff85edd0 >> 0x20);
  if (uVar1 == 0) {
    if (iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x23,"main","sorted[0]",1);
    }
    uVar1 = (uint)(iVar7 != 1);
    if (iVar7 != 1) goto LAB_00101327;
    if (iVar8 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x24,"main","sorted[1]",2);
      uVar1 = 1;
      goto LAB_00101327;
    }
    if (iVar9 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x25,"main","sorted[2]",3);
      uVar1 = 1;
      goto LAB_00101327;
    }
    bVar6 = iVar10 == 4;
    if (!bVar6) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x26,"main","sorted[3]",4);
      uVar1 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x22,"main",(ulong)uVar1,"sort");
LAB_00101327:
    bVar6 = false;
  }
  if (!bVar6) {
    return uVar1;
  }
  uVar2 = ref_sort_insertion_int
                    (4,(REF_INT *)&stack0xffffffffffc2f6c8,(REF_INT *)&stack0xffffffffff85edc8);
  if (uVar2 == 0) {
    if (iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x30,"main","sorted[0]",1);
      uVar2 = 1;
      goto LAB_001014b8;
    }
    if (iVar8 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x31,"main","sorted[1]",2);
      uVar2 = 1;
      goto LAB_001014b8;
    }
    if (iVar9 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x32,"main","sorted[2]",3);
      uVar2 = 1;
      goto LAB_001014b8;
    }
    bVar6 = iVar10 == 4;
    uVar2 = uVar1;
    if (!bVar6) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x33,"main","sorted[3]",4);
      uVar2 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x2f,"main",(ulong)uVar2,"sort");
LAB_001014b8:
    bVar6 = false;
  }
  if (!bVar6) {
    return uVar2;
  }
  uVar1 = ref_sort_insertion_int
                    (4,(REF_INT *)&stack0xffffffffffc2f6c8,(REF_INT *)&stack0xffffffffff85edc8);
  if (uVar1 == 0) {
    if (iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x3d,"main","sorted[0]",1);
      uVar1 = 1;
      goto LAB_00101649;
    }
    if (iVar8 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x3e,"main","sorted[1]",2);
      uVar1 = 1;
      goto LAB_00101649;
    }
    if (iVar9 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x3f,"main","sorted[2]",3);
      uVar1 = 1;
      goto LAB_00101649;
    }
    bVar6 = iVar10 == 4;
    uVar1 = uVar2;
    if (!bVar6) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x40,"main","sorted[3]",4);
      uVar1 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x3c,"main",(ulong)uVar1,"sort");
LAB_00101649:
    bVar6 = false;
  }
  if (!bVar6) {
    return uVar1;
  }
  uVar2 = ref_sort_unique_int(4,(REF_INT *)&stack0xffffffffffc2f6c8,
                              (REF_INT *)&stack0xffffffffff85ed88,
                              (REF_INT *)&stack0xffffffffff85edc8);
  if (uVar2 == 0) {
    if (in_stack_ffffffffff85ed88 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x4a,"main","m",3);
      uVar2 = 1;
      goto LAB_001017df;
    }
    if (iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x4b,"main","unique[0]",1);
      uVar2 = 1;
      goto LAB_001017df;
    }
    if (iVar8 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x4c,"main","unique[1]",2);
      uVar2 = 1;
      goto LAB_001017df;
    }
    bVar6 = iVar9 == 3;
    uVar2 = uVar1;
    if (!bVar6) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x4d,"main","unique[2]",3);
      uVar2 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x49,"main",(ulong)uVar2,"unique");
LAB_001017df:
    bVar6 = false;
  }
  if (!bVar6) {
    return uVar2;
  }
  uVar1 = ref_sort_same(4,(REF_INT *)&stack0xffffffffffc2f6c8,(REF_INT *)&stack0xffffffffff85edc8,
                        (REF_BOOL *)&stack0xffffffffff85ed88);
  if (uVar1 == 0) {
    bVar6 = true;
    if (in_stack_ffffffffff85ed88 == 0) {
      bVar6 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x5d,"main","same");
      uVar2 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x5c,"main",(ulong)uVar1,"same");
    bVar6 = false;
    uVar2 = uVar1;
  }
  if (!bVar6) {
    return uVar2;
  }
  uVar1 = ref_sort_same(4,(REF_INT *)&stack0xffffffffffc2f6c8,(REF_INT *)&stack0xffffffffff85edc8,
                        (REF_BOOL *)&stack0xffffffffff85ed88);
  if (uVar1 == 0) {
    bVar6 = true;
    if (in_stack_ffffffffff85ed88 == 0) {
      bVar6 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x6c,"main","same");
      uVar2 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x6b,"main",(ulong)uVar1,"same");
    bVar6 = false;
    uVar2 = uVar1;
  }
  if (!bVar6) {
    return uVar2;
  }
  uVar1 = ref_sort_same(4,(REF_INT *)&stack0xffffffffffc2f6c8,(REF_INT *)&stack0xffffffffff85edc8,
                        (REF_BOOL *)&stack0xffffffffff85ed88);
  if (uVar1 == 0) {
    if (in_stack_ffffffffff85ed88 == 0) {
      bVar6 = true;
    }
    else {
      bVar6 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x7c,"main","same");
      uVar2 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x7b,"main",(ulong)uVar1,"same");
    bVar6 = false;
    uVar2 = uVar1;
  }
  if (!bVar6) {
    return uVar2;
  }
  uVar1 = ref_sort_same(4,(REF_INT *)&stack0xffffffffffc2f6c8,(REF_INT *)&stack0xffffffffff85edc8,
                        (REF_BOOL *)&stack0xffffffffff85ed88);
  if (uVar1 == 0) {
    if (in_stack_ffffffffff85ed88 == 0) {
      bVar6 = true;
    }
    else {
      bVar6 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x8c,"main","same");
      uVar2 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x8b,"main",(ulong)uVar1,"same");
    bVar6 = false;
    uVar2 = uVar1;
  }
  if (!bVar6) {
    return uVar2;
  }
  lVar4 = 0;
  uVar1 = 0;
  do {
    if (*(long *)(&stack0xffffffffffc2f6c8 + lVar4 * 8) != -1) {
      *(long *)(&stack0xffffffffff85edc8 + (long)(int)uVar1 * 8) =
           *(long *)(&stack0xffffffffffc2f6c8 + lVar4 * 8);
      *(int *)(&stack0xffffffffff85ed88 + (long)(int)uVar1 * 4) = (int)lVar4;
      uVar1 = uVar1 + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  uVar3 = ref_sort_heap_glob(uVar1,(REF_GLOB *)&stack0xffffffffff85edc8,
                             (REF_INT *)&stack0xffffffffff85eda8);
  if (uVar3 == 0) {
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        iVar7 = *(int *)(&stack0xffffffffff85ed88 +
                        (long)*(int *)(&stack0xffffffffff85eda8 + uVar5 * 4) * 4);
        *(int *)(&stack0xffffffffff85eda8 + uVar5 * 4) = iVar7;
        *(undefined8 *)(&stack0xffffffffff85edc8 + uVar5 * 8) =
             *(undefined8 *)(&stack0xffffffffffc2f6c8 + (long)iVar7 * 8);
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    uVar3 = ref_sort_search_glob
                      (uVar1,(REF_GLOB *)&stack0xffffffffff85edc8,10,
                       (REF_INT *)&stack0xffffffffff85ed84);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xa8,"main",(ulong)uVar3,"search");
      goto LAB_00101d21;
    }
    if (*(int *)(&stack0xffffffffff85eda8 + (long)in_stack_ffffffffff85ed84 * 4) != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xa9,"main","0",0);
      uVar3 = 1;
      goto LAB_00101d21;
    }
    uVar3 = ref_sort_search_glob
                      (uVar1,(REF_GLOB *)&stack0xffffffffff85edc8,0x1e,
                       (REF_INT *)&stack0xffffffffff85ed84);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xab,"main",(ulong)uVar3,"search");
      goto LAB_00101d21;
    }
    if (*(int *)(&stack0xffffffffff85eda8 + (long)in_stack_ffffffffff85ed84 * 4) != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xac,"main","2",2);
      uVar3 = 1;
      goto LAB_00101d21;
    }
    uVar3 = ref_sort_search_glob
                      (uVar1,(REF_GLOB *)&stack0xffffffffff85edc8,0x14,
                       (REF_INT *)&stack0xffffffffff85ed84);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xae,"main",(ulong)uVar3,"search");
      goto LAB_00101d21;
    }
    bVar6 = *(int *)(&stack0xffffffffff85eda8 + (long)in_stack_ffffffffff85ed84 * 4) == 5;
    if (!bVar6) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xaf,"main","5",5);
      uVar2 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0xa2,"main",(ulong)uVar3,"sort");
LAB_00101d21:
    bVar6 = false;
    uVar2 = uVar3;
  }
  if (!bVar6) {
    return uVar2;
  }
  uVar1 = ref_sort_heap_glob(4,(REF_GLOB *)&stack0xffffffffffc2f6c8,
                             (REF_INT *)&stack0xffffffffff85ed88);
  if (uVar1 == 0) {
    lVar4 = 0;
    do {
      *(undefined8 *)(&stack0xffffffffff85edc8 + lVar4 * 8) =
           *(undefined8 *)
            (&stack0xffffffffffc2f6c8 + (long)*(int *)(&stack0xffffffffff85ed88 + lVar4 * 4) * 8);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    uVar1 = ref_sort_search_glob
                      (4,(REF_GLOB *)&stack0xffffffffff85edc8,0x28,
                       (REF_INT *)&stack0xffffffffff85eda8);
    if (uVar1 == 0) {
      if (*(int *)(&stack0xffffffffff85ed88 + (long)in_stack_ffffffffff85eda8 * 4) == 0) {
        uVar1 = ref_sort_search_glob
                          (4,(REF_GLOB *)&stack0xffffffffff85edc8,10,
                           (REF_INT *)&stack0xffffffffff85eda8);
        if (uVar1 == 0) {
          if (*(int *)(&stack0xffffffffff85ed88 + (long)in_stack_ffffffffff85eda8 * 4) == 1) {
            uVar1 = ref_sort_search_glob
                              (4,(REF_GLOB *)&stack0xffffffffff85edc8,0x1e,
                               (REF_INT *)&stack0xffffffffff85eda8);
            if (uVar1 == 0) {
              if (*(int *)(&stack0xffffffffff85ed88 + (long)in_stack_ffffffffff85eda8 * 4) == 2) {
                uVar1 = ref_sort_search_glob
                                  (4,(REF_GLOB *)&stack0xffffffffff85edc8,0x14,
                                   (REF_INT *)&stack0xffffffffff85eda8);
                if (uVar1 == 0) {
                  bVar6 = *(int *)(&stack0xffffffffff85ed88 + (long)in_stack_ffffffffff85eda8 * 4)
                          == 3;
                  if (!bVar6) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                           ,0xc4,"main","3",3);
                    uVar2 = 1;
                  }
                  goto LAB_00102002;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                       ,0xc3,"main",(ulong)uVar1,"search");
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                       ,0xc2,"main","2",2);
                uVar1 = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                     ,0xc1,"main",(ulong)uVar1,"search");
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                   ,0xc0,"main","1",1);
            uVar1 = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                 ,0xbf,"main",(ulong)uVar1,"search");
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
               ,0xbe,"main","0",0);
        uVar1 = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xbd,"main",(ulong)uVar1,"search");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0xb9,"main",(ulong)uVar1,"sort");
  }
  bVar6 = false;
  uVar2 = uVar1;
LAB_00102002:
  if (bVar6) {
    uVar2 = ref_sort_search_glob
                      (4,(REF_GLOB *)&stack0xffffffffffc2f6c8,10,(REF_INT *)&stack0xffffffffff85edc8
                      );
    if (uVar2 == 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xd1,"main","0",0);
      uVar2 = 1;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0xd0,"main",(ulong)uVar2,"search");
    }
  }
  return uVar2;
}

Assistant:

int main(void) {
  { /* insert sort ordered */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 1;
    original[1] = 2;
    original[2] = 3;
    original[3] = 4;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* insert sort flip */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 4;
    original[1] = 3;
    original[2] = 2;
    original[3] = 1;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* insert sort flip flip */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 2;
    original[1] = 1;
    original[2] = 4;
    original[3] = 3;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* unique */
    REF_INT n = 4, original[4], m, unique[4];
    original[0] = 2;
    original[1] = 1;
    original[2] = 2;
    original[3] = 3;
    RSS(ref_sort_unique_int(n, original, &m, unique), "unique");
    REIS(3, m, "m");
    REIS(1, unique[0], "unique[0]");
    REIS(2, unique[1], "unique[1]");
    REIS(3, unique[2], "unique[2]");
  }

  { /* same */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 0;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(same, "same");
  }
  { /* same */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 4;
    list0[1] = 7;
    list0[2] = 6;
    list0[3] = 5;

    list1[0] = 4;
    list1[1] = 7;
    list1[2] = 6;
    list1[3] = 5;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(same, "same");
  }

  { /* same repeat */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 3;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(!same, "same");
  }

  { /* same diff */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 5;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(!same, "same");
  }

  { /* sparse global to local */
    REF_INT n = 7, i;
    REF_GLOB global[7], sorted_global[7];
    REF_INT pack[7], sorted_index[7], position, total;
    global[0] = 10;
    global[1] = REF_EMPTY;
    global[2] = 30;
    global[3] = REF_EMPTY;
    global[4] = REF_EMPTY;
    global[5] = 20;
    global[6] = REF_EMPTY;
    total = 0;
    for (i = 0; i < n; i++) {
      if (REF_EMPTY != global[i]) {
        sorted_global[total] = global[i];
        pack[total] = i;
        total++;
      }
    }
    RSS(ref_sort_heap_glob(total, sorted_global, sorted_index), "sort");
    for (i = 0; i < total; i++) {
      sorted_index[i] = pack[sorted_index[i]];
      sorted_global[i] = global[sorted_index[i]];
    }
    RSS(ref_sort_search_glob(total, sorted_global, global[0], &position),
        "search");
    REIS(0, sorted_index[position], "0");
    RSS(ref_sort_search_glob(total, sorted_global, global[2], &position),
        "search");
    REIS(2, sorted_index[position], "2");
    RSS(ref_sort_search_glob(total, sorted_global, global[5], &position),
        "search");
    REIS(5, sorted_index[position], "5");
  }

  { /* dense global to local */
    REF_GLOB global[4], sorted_global[4];
    REF_INT n = 4, i, sorted_index[4], position;
    global[0] = 40;
    global[1] = 10;
    global[2] = 30;
    global[3] = 20;
    RSS(ref_sort_heap_glob(n, global, sorted_index), "sort");
    for (i = 0; i < n; i++) {
      sorted_global[i] = global[sorted_index[i]];
    }
    RSS(ref_sort_search_glob(n, sorted_global, global[0], &position), "search");
    REIS(0, sorted_index[position], "0");
    RSS(ref_sort_search_glob(n, sorted_global, global[1], &position), "search");
    REIS(1, sorted_index[position], "1");
    RSS(ref_sort_search_glob(n, sorted_global, global[2], &position), "search");
    REIS(2, sorted_index[position], "2");
    RSS(ref_sort_search_glob(n, sorted_global, global[3], &position), "search");
    REIS(3, sorted_index[position], "3");
  }

  { /* search */
    REF_INT n = 4, position;
    REF_GLOB ascending_list[4];
    ascending_list[0] = 10;
    ascending_list[1] = 20;
    ascending_list[2] = 30;
    ascending_list[3] = 40;

    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[0], &position),
        "search");
    REIS(0, position, "0");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[1], &position),
        "search");
    REIS(1, position, "1");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[2], &position),
        "search");
    REIS(2, position, "2");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[3], &position),
        "search");
    REIS(3, position, "3");

    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 0, &position),
         "search");
    REIS(REF_EMPTY, position, "0");
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 15, &position),
         "search");
    REIS(REF_EMPTY, position, "15");
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 50, &position),
         "search");
    REIS(REF_EMPTY, position, "50");
  }

  { /* search 0 */
    REF_INT n = 0, position;
    REF_GLOB *ascending_list = NULL;

    position = 0;
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 17, &position),
         "search");
    REIS(REF_EMPTY, position, "0");
  }

  { /* search dbl */
    REF_INT n = 4, position = 0;
    REF_DBL ascending_list[] = {0.0, 0.5, 1.0, 2.0};

    REIS(REF_NOT_FOUND, ref_sort_search_dbl(0, ascending_list, -1.0, &position),
         "search");
    REIS(REF_EMPTY, position, "under");

    RSS(ref_sort_search_dbl(1, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(1, ascending_list, 0.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(1, ascending_list, 1.0, &position), "search");
    REIS(0, position, "only");

    RSS(ref_sort_search_dbl(2, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.1, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.5, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 1.0, &position), "search");
    REIS(0, position, "only");

    RSS(ref_sort_search_dbl(n, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 0.1, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 0.5, &position), "search");
    REIS(1, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 1.0, &position), "search");
    REIS(2, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 1.5, &position), "search");
    REIS(2, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 5.0, &position), "search");
    REIS(2, position, "only");
  }

  { /* heap sort zero int */
    REF_INT n = 0, original[1], sorted_index[1];
    original[0] = 1;
    sorted_index[0] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(2, sorted_index[0], "sorted_index[0]");
  }

  { /* heap sort one int */
    REF_INT n = 1, original[1], sorted_index[1];
    original[0] = 1;
    sorted_index[0] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
  }

  { /* heap two order int */
    REF_INT n = 2, original[2], sorted_index[2];
    original[0] = 1;
    original[1] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
    REIS(1, sorted_index[1], "sorted_index[1]");
  }

  { /* heap two reversed int */
    REF_INT n = 2, original[2], sorted_index[2];
    original[0] = 2;
    original[1] = 1;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(1, sorted_index[0], "sorted_index[0]");
    REIS(0, sorted_index[1], "sorted_index[1]");
  }

  { /* heap three 012 int */
    REF_INT n = 3, original[3], sorted_index[3];
    original[0] = 0;
    original[1] = 1;
    original[2] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
    REIS(1, sorted_index[1], "sorted_index[1]");
    REIS(2, sorted_index[2], "sorted_index[2]");
  }

  { /* heap three 120 int */
    REF_INT n = 3, original[3], sorted_index[3];
    original[0] = 2;
    original[1] = 0;
    original[2] = 1;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(1, sorted_index[0], "sorted_index[0]");
    REIS(2, sorted_index[1], "sorted_index[1]");
    REIS(0, sorted_index[2], "sorted_index[2]");
  }

  { /* heap dbl */
    REF_INT n = 4;
    REF_DBL original[4];
    REF_INT sorted_index[4];
    original[0] = 0.0;
    original[1] = 7.0;
    original[2] = 3.0;
    original[3] = -1.0;
    RSS(ref_sort_heap_dbl(n, original, sorted_index), "sort");
    REIS(3, sorted_index[0], "sorted_index[0]");
    REIS(0, sorted_index[1], "sorted_index[1]");
    REIS(2, sorted_index[2], "sorted_index[2]");
    REIS(1, sorted_index[3], "sorted_index[3]");
  }

  { /* rand range */
    REF_INT min = 1, max = 14;
    REF_INT count[16], m = 16;
    REF_INT i, j, n = 1000000;
    for (j = 0; j < m; j++) count[j] = 0;
    for (i = 0; i < n; i++) {
      j = ref_sort_rand_in_range(min, max);
      count[j]++;
    }
    REIS(0, count[min - 1], "min off-by-one");
    RAS(0 != count[min], "zero min");
    RAS(0 != count[max], "zero max");
    REIS(0, count[max + 1], "max off-by-one");
  }

  { /* rand range */
    REF_INT n = 1000000, permutation[1000000], count[1000000];
    REF_INT i;
    RSS(ref_sort_shuffle(n, permutation), "shuffle");
    for (i = 0; i < n; i++) count[i] = 0;
    for (i = 0; i < n; i++) count[permutation[i]]++;
    for (i = 0; i < n; i++) REIS(1, count[i], "missing/dup entry");
  }

  return 0;
}